

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

Expression * __thiscall
wasm::Builder::replaceWithIdenticalType<wasm::Block>(Builder *this,Block *curr)

{
  Type *this_00;
  _Storage<wasm::Type,_true> _Var1;
  ulong uVar2;
  bool bVar3;
  BasicHeapType BVar4;
  Shareability SVar5;
  HeapType HVar6;
  Const *pCVar7;
  Block *pBVar8;
  Literal *this_01;
  RefNull *output;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  Literals local_d0;
  HeapType HStack_98;
  array<unsigned_char,_16UL> bytes;
  Literal local_80;
  undefined1 auStack_68 [8];
  Literal value;
  anon_union_16_6_1532cd5a_for_Literal_0 local_48;
  undefined8 local_38;
  
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type;
  _Var1 = (_Storage<wasm::Type,_true>)
          (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
  if ((((ulong)_Var1 & 1) != 0 && 6 < (ulong)_Var1) &&
     (bVar3 = wasm::Type::isDefaultable(this_00), bVar3)) {
    Literal::makeZeros(&local_d0,(Type)this_00->id);
    curr = (Block *)makeConstantExpression(this,&local_d0);
    if ((_Storage<wasm::Type,_true>)
        (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id != _Var1)
    {
      auStack_68 = (undefined1  [8])&local_48;
      value.field_0.i64 = 1;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = _Var1;
      local_48.exnData.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)curr;
      curr = makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                       (this,(initializer_list<wasm::Expression_*> *)auStack_68,type);
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              (&local_d0.super_SmallVector<wasm::Literal,_1UL>.flexible);
    this_01 = local_d0.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems;
    goto LAB_00b8a633;
  }
  uVar2 = this_00->id;
  if (((uint)uVar2 & 3) == 2 && 6 < uVar2) {
    auStack_68 = (undefined1  [8])wasm::Type::getHeapType(this_00);
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = RefNullId;
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    BVar4 = HeapType::getBottom((HeapType *)auStack_68);
    if (((uint)(0x7c < BVar4) * 4 + 3 & BVar4) != 0) {
      __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
    }
    RefNull::finalize((RefNull *)curr,(Type)((ulong)BVar4 | 2));
LAB_00b8a4d9:
    if ((_Storage<wasm::Type,_true>)
        (((SpecificExpression<(wasm::Expression::Id)59> *)
         &curr->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression).type.id ==
        _Var1) {
      return (Expression *)curr;
    }
    auStack_68 = (undefined1  [8])&local_48;
    value.field_0.i64 = 1;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 1;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = _Var1;
    local_48.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)curr;
    pBVar8 = makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                       (this,(initializer_list<wasm::Expression_*> *)auStack_68,type_00);
    return (Expression *)pBVar8;
  }
  if (((uVar2 & 1) == 0 && 6 < uVar2) &&
     (HVar6 = wasm::Type::getHeapType(this_00), ((uint)HVar6.id & 0x7b) == 0x30 && HVar6.id < 0x7d))
  {
    pCVar7 = makeConst<int>(this,0);
    HStack_98 = wasm::Type::getHeapType(this_00);
    SVar5 = HeapType::getShared(&HStack_98);
    curr = (Block *)MixedArena::allocSpace(&this->wasm->allocator,0x18,8);
    (((SpecificExpression<(wasm::Expression::Id)59> *)
     &curr->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression)._id = RefI31Id;
    (curr->name).super_IString.str._M_len = (size_t)pCVar7;
    (((SpecificExpression<(wasm::Expression::Id)59> *)
     &curr->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression).type.id =
         (ulong)(SVar5 == Shared) * 4 + 0x30;
    RefI31::finalize((RefI31 *)curr);
    goto LAB_00b8a4d9;
  }
  if (6 < this_00->id) {
    return (Expression *)curr;
  }
  auStack_68 = (undefined1  [8])0x0;
  value.field_0.i64 = 0;
  value.field_0.func.super_IString.str._M_str = (char *)0x0;
  switch(this_00->id & 0xffffffff) {
  case 0:
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = NopId;
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    goto LAB_00b8a62f;
  case 1:
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = UnreachableId;
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 1;
    goto LAB_00b8a62f;
  case 2:
    local_48.func.super_IString.str._M_len =
         (ulong)(uint)local_48.func.super_IString.str._M_len._4_4_ << 0x20;
    local_38 = 2;
    Literal::operator=((Literal *)auStack_68,(Literal *)&local_48.func);
    break;
  case 3:
    local_48.i64 = 0;
    local_38 = 3;
    Literal::operator=((Literal *)auStack_68,(Literal *)&local_48.func);
    break;
  case 4:
    local_48.func.super_IString.str._M_len =
         (ulong)(uint)local_48.func.super_IString.str._M_len._4_4_ << 0x20;
    local_38 = 4;
    Literal::operator=((Literal *)auStack_68,(Literal *)&local_48.func);
    break;
  case 5:
    local_48.i64 = 0;
    local_38 = 5;
    Literal::operator=((Literal *)auStack_68,(Literal *)&local_48.func);
    break;
  case 6:
    HStack_98.id = 0;
    bytes._M_elems[0] = '\0';
    bytes._M_elems[1] = '\0';
    bytes._M_elems[2] = '\0';
    bytes._M_elems[3] = '\0';
    bytes._M_elems[4] = '\0';
    bytes._M_elems[5] = '\0';
    bytes._M_elems[6] = '\0';
    bytes._M_elems[7] = '\0';
    Literal::Literal((Literal *)&local_48.func,(uint8_t *)&HStack_98);
    Literal::operator=((Literal *)auStack_68,(Literal *)&local_48.func);
    break;
  default:
    goto switchD_00b8a547_default;
  }
  Literal::~Literal((Literal *)&local_48.func);
switchD_00b8a547_default:
  Literal::Literal(&local_80,(Literal *)auStack_68);
  curr = (Block *)makeConst(this,&local_80);
  Literal::~Literal(&local_80);
LAB_00b8a62f:
  this_01 = (Literal *)auStack_68;
LAB_00b8a633:
  Literal::~Literal(this_01);
  return (Expression *)curr;
}

Assistant:

Expression* replaceWithIdenticalType(T* curr) {
    auto type = curr->type;
    // Anything that would otherwise have a more refined type than the original
    // expression needs to be wrapped in a block with the original type.
    auto maybeWrap = [&](Expression* expr) -> Expression* {
      return expr->type == type ? expr : makeBlock({expr}, type);
    };
    if (curr->type.isTuple() && curr->type.isDefaultable()) {
      return maybeWrap(makeConstantExpression(Literal::makeZeros(curr->type)));
    }
    if (curr->type.isNullable()) {
      return maybeWrap(
        ExpressionManipulator::refNull(curr, curr->type.getHeapType()));
    }
    if (curr->type.isRef() &&
        curr->type.getHeapType().isMaybeShared(HeapType::i31)) {
      return maybeWrap(
        makeRefI31(makeConst(0), curr->type.getHeapType().getShared()));
    }
    if (!curr->type.isBasic()) {
      // We can't do any better, keep the original.
      return curr;
    }
    Literal value;
    // TODO: reuse node conditionally when possible for literals
    switch (curr->type.getBasic()) {
      case Type::i32:
        value = Literal(int32_t(0));
        break;
      case Type::i64:
        value = Literal(int64_t(0));
        break;
      case Type::f32:
        value = Literal(float(0));
        break;
      case Type::f64:
        value = Literal(double(0));
        break;
      case Type::v128: {
        std::array<uint8_t, 16> bytes;
        bytes.fill(0);
        value = Literal(bytes.data());
        break;
      }
      case Type::none:
        return ExpressionManipulator::nop(curr);
      case Type::unreachable:
        return ExpressionManipulator::unreachable(curr);
    }
    return makeConst(value);
  }